

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest-main.cc
# Opt level: O0

void __thiscall
gflags::anon_unknown_5::Test_MacroArgs_EvaluateOnce::Test_MacroArgs_EvaluateOnce
          (Test_MacroArgs_EvaluateOnce *this)

{
  value_type local_18;
  Test_MacroArgs_EvaluateOnce *local_10;
  Test_MacroArgs_EvaluateOnce *this_local;
  
  local_18 = Run;
  local_10 = this;
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::push_back(&g_testlist,&local_18);
  return;
}

Assistant:

TEST(MacroArgs, EvaluateOnce) {
  EXPECT_EQ(13, FLAGS_changeable_var);
  // Make sure we don't ++ the value somehow, when evaluating the flag.
  EXPECT_EQ(13, FLAGS_changeable_var);
  // Make sure the macro only evaluated this var once.
  EXPECT_EQ(13, changeable_var);
  // Make sure the actual value and default value are the same
  SetCommandLineOptionWithMode("changeable_var", "21", SET_FLAG_IF_DEFAULT);
  EXPECT_EQ(21, FLAGS_changeable_var);
}